

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O3

PClass * __thiscall AHealth::StaticType(AHealth *this)

{
  return RegistrationInfo.MyClass;
}

Assistant:

IMPLEMENT_CLASS (AHealth)

//===========================================================================
//
// AHealth :: PickupMessage
//
//===========================================================================
const char *AHealth::PickupMessage ()
{
	int threshold = GetClass()->LowHealth;

	if (PrevHealth < threshold)
	{
		FString message = GetClass()->LowHealthMessage;

		if (message.IsNotEmpty())
		{
			return message;
		}
	}
	return Super::PickupMessage();
}